

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void println(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if ((((list_level == 0) || (xlist == 0)) || (asm_opt[0] == 0)) ||
     ((expand_macro != 0 && (asm_opt[1] == 0)))) {
    return;
  }
  if (continued_line != 0) {
    strcpy(prlnbuf,tmplnbuf);
  }
  if (data_loccnt != -1) {
    iVar1 = 0;
    loadlc(data_loccnt,0);
    iVar2 = loccnt - data_loccnt;
    if (data_level <= list_level || iVar2 < 4) {
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      while (iVar3 = data_loccnt, bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        if ((long)bank < 0xf0) {
          hexcon(2,(uint)rom[bank][data_loccnt],prlnbuf + (long)(iVar1 * 3) + 0x10);
        }
        else {
          (prlnbuf + (long)iVar1 * 3 + 0x10)[0] = '-';
          (prlnbuf + (long)iVar1 * 3 + 0x10)[1] = '-';
          iVar3 = data_loccnt;
        }
        data_loccnt = iVar3 + 1;
        iVar1 = iVar1 + 1;
        if (iVar1 == data_size) {
          iVar1 = 0;
          fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
          builtin_strncpy(prlnbuf,"                          ",0x1a);
          prlnbuf[0x1b] = '\0';
          loadlc(data_loccnt,0);
        }
      }
      if (iVar1 == 0) {
        return;
      }
    }
  }
  fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
  return;
}

Assistant:

void
println(void)
{
	int nb, cnt;
	int i;

	/* check if output possible */
	if (list_level == 0)
		return;
	if (!xlist || !asm_opt[OPT_LIST] || (expand_macro && !asm_opt[OPT_MACRO]))
		return;

	/* update line buffer if necessary */
	if (continued_line)
		strcpy(prlnbuf, tmplnbuf);

	/* output */
	if (data_loccnt == -1)
		/* line buffer */
		fprintf(lst_fp, "%s\n", prlnbuf);
	else {
		/* line buffer + data bytes */
		loadlc(data_loccnt, 0);

		/* number of bytes */
		nb = loccnt - data_loccnt;

		/* check level */
		if ((data_level > list_level) && (nb > 3))
			/* doesn't match */
			fprintf(lst_fp, "%s\n", prlnbuf);
		else {
			/* ok */
			cnt = 0;
			for (i = 0; i < nb; i++) {
				if (bank >= RESERVED_BANK) {
					prlnbuf[16 + (3*cnt)] = '-';
					prlnbuf[17 + (3*cnt)] = '-';
				}
				else {
					hexcon(2, rom[bank][data_loccnt], &prlnbuf[16 + (3*cnt)]);
				}
				data_loccnt++;
				cnt++;
				if (cnt == data_size) {
					cnt = 0;
					fprintf(lst_fp, "%s\n", prlnbuf);
					clearln();
					loadlc(data_loccnt, 0);
				}
			}
			if (cnt)
				fprintf(lst_fp, "%s\n", prlnbuf);
		}
	}
}